

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O0

undefined8 mask_to_string_abi_cxx11_(uint64_t mask)

{
  int iVar1;
  ulong in_RSI;
  undefined8 in_RDI;
  uint i;
  uint v;
  uint len;
  ostringstream ss;
  int local_194;
  int local_18c;
  ostringstream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_18c = 0;
  local_194 = 0x40;
  while (iVar1 = local_194 + -1, local_194 != 0) {
    if ((local_10 >> ((byte)iVar1 & 0x3f) & 1) == 0) {
      local_194 = iVar1;
      if (local_18c != 0) {
        std::operator<<((ostream *)local_188,'0');
      }
    }
    else {
      if (local_18c == 0) {
        local_18c = local_194;
      }
      std::operator<<((ostream *)local_188,'1');
      local_194 = iVar1;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string
mask_to_string(uint64_t mask)
{
    std::ostringstream ss;
    unsigned len = 0;
    unsigned v = 0;
    unsigned i = 64;
    while (i--)
    {
        v = mask >> i;
        if (1ULL & v)
        {
            if (len == 0) len = i + 1;
            ss << '1';
        }
        else
            if (len > 0) ss << '0';
    }
    return ss.str();
}